

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O0

bool __thiscall cppnet::EpollEventActions::DelEvent(EpollEventActions *this,Event *event)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  epoll_event *__event;
  element_type *peVar4;
  uint64_t uVar5;
  SingletonLogger *pSVar6;
  uint *puVar7;
  int32_t ret;
  epoll_event *ev;
  undefined1 local_30 [8];
  shared_ptr<cppnet::Socket> sock;
  Event *event_local;
  EpollEventActions *this_local;
  
  sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)event;
  Event::GetSocket((Event *)local_30);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar2) {
    __event = (epoll_event *)
              Event::GetData((Event *)sock.
                                      super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi);
    iVar3 = this->_epoll_handler;
    peVar4 = std::__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    uVar5 = Socket::GetSocket(peVar4);
    iVar3 = epoll_ctl(iVar3,2,(int)uVar5,__event);
    if (iVar3 < 0) {
      pSVar6 = Singleton<cppnet::SingletonLogger>::Instance();
      puVar7 = (uint *)__errno_location();
      uVar1 = *puVar7;
      peVar4 = std::__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      uVar5 = Socket::GetSocket(peVar4);
      SingletonLogger::Error
                (pSVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x10a,"remove event from EPOLL failed! error :%d, socket : %d",(ulong)uVar1,uVar5)
      ;
      this_local._7_1_ = false;
    }
    else {
      Event::ClearType((Event *)sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi);
      pSVar6 = Singleton<cppnet::SingletonLogger>::Instance();
      peVar4 = std::__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      uVar5 = Socket::GetSocket(peVar4);
      SingletonLogger::Debug
                (pSVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x10f,"remove a socket from EPOLL, %d",uVar5);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  std::shared_ptr<cppnet::Socket>::~shared_ptr((shared_ptr<cppnet::Socket> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool EpollEventActions::DelEvent(Event* event) {
    auto sock = event->GetSocket();
    if (!sock) {
        return false;
    }
    epoll_event* ev = (epoll_event*)event->GetData();
    int32_t ret = epoll_ctl(_epoll_handler, EPOLL_CTL_DEL, sock->GetSocket(), ev);
    if (ret < 0) {
        LOG_ERROR("remove event from EPOLL failed! error :%d, socket : %d", errno, sock->GetSocket());
        return false;
    }

    event->ClearType();
    LOG_DEBUG("remove a socket from EPOLL, %d", sock->GetSocket());
    return true;
}